

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::AddXiValue(GridAxisIrregular *this,KUINT16 Xi)

{
  iterator __position;
  unsigned_short *puVar1;
  KUINT16 local_a;
  
  __position._M_current =
       (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_a = Xi;
  if (__position._M_current ==
      (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_realloc_insert<unsigned_short_const&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vXiValues,
               __position,&local_a);
    puVar1 = (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = Xi;
    puVar1 = __position._M_current + 1;
    (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (this->super_GridAxisRegular).m_ui16NumPoints =
       (KUINT16)((uint)((int)puVar1 -
                       *(int *)&(this->m_vXiValues).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
  calculatePadding(this);
  return;
}

Assistant:

void GridAxisIrregular::AddXiValue( KUINT16 Xi )
{
    m_vXiValues.push_back( Xi );
    m_ui16NumPoints = m_vXiValues.size();
    calculatePadding();
}